

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O3

void Vec_IntInsert(Vec_Int_t *p,int iHere,int Entry)

{
  int *piVar1;
  long lVar2;
  int iVar3;
  
  if (iHere <= p->nSize) {
    Vec_IntPush(p,0);
    iVar3 = p->nSize + -1;
    piVar1 = p->pArray;
    if (iHere < iVar3) {
      lVar2 = (long)p->nSize + -1;
      do {
        piVar1[lVar2] = piVar1[lVar2 + -1];
        lVar2 = lVar2 + -1;
      } while (iHere < lVar2);
      iVar3 = (int)lVar2;
    }
    piVar1[iVar3] = Entry;
    return;
  }
  __assert_fail("iHere >= 0 && iHere <= p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x41e,"void Vec_IntInsert(Vec_Int_t *, int, int)");
}

Assistant:

static inline void Vec_IntInsert( Vec_Int_t * p, int iHere, int Entry )
{
    int i;
    assert( iHere >= 0 && iHere <= p->nSize );
    Vec_IntPush( p, 0 );
    for ( i = p->nSize - 1; i > iHere; i-- )
        p->pArray[i] = p->pArray[i-1];
    p->pArray[i] = Entry;
}